

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O2

void compute_response_layer_Dyy_top(response_layer *layer,integral_image *iimage)

{
  int iVar1;
  int cols;
  int iVar2;
  int iVar3;
  float *pfVar4;
  bool *pbVar5;
  float *pfVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int rows;
  uint uVar10;
  int cols_00;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  float *pfVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  ulong uVar33;
  bool *pbVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  int iVar38;
  long lVar39;
  int iVar40;
  int iVar41;
  int col;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  float *local_1c8;
  int local_198;
  int local_190;
  float *local_180;
  float *local_148;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  undefined1 extraout_var_05 [60];
  undefined1 extraout_var_06 [60];
  undefined1 extraout_var_07 [60];
  
  pfVar4 = layer->response;
  iVar26 = iimage->data_width;
  lVar39 = (long)iVar26;
  iVar1 = layer->step;
  lVar37 = (long)iVar1;
  cols = layer->filter_size;
  pbVar5 = layer->laplacian;
  iVar2 = layer->width;
  iVar3 = layer->height;
  cols_00 = cols / 3;
  iVar11 = (cols + -1) / 2;
  pfVar6 = iimage->data;
  iVar25 = iimage->width;
  fVar42 = 1.0 / (float)(cols * cols);
  uVar10 = cols / 6;
  lVar35 = (long)iVar11;
  lVar19 = (long)cols_00;
  iVar12 = -uVar10;
  iVar15 = -cols_00;
  iVar13 = -iVar11;
  iVar16 = iVar26 * iVar11 + cols_00;
  iVar14 = cols_00 + ~uVar10;
  rows = cols_00 * 2 + -1;
  iVar38 = iVar26 * iVar14 + cols_00;
  for (iVar32 = 0; iVar32 <= (int)uVar10; iVar32 = iVar32 + iVar1) {
    iVar17 = iVar32 - cols_00;
    lVar20 = (long)((iVar32 / iVar1) * iVar2);
    iVar40 = 1;
    for (lVar27 = 0; lVar27 < lVar19; lVar27 = lVar27 + lVar37) {
      auVar9 = vfmadd213ss_fma(ZEXT416((uint)pfVar6[iVar38 + -2 + iVar40]),
                               SUB6416(ZEXT464(0xc0400000),0),
                               ZEXT416((uint)pfVar6[iVar16 + -2 + iVar40]));
      fVar43 = box_integral(iimage,iVar17 + 1,iVar13 + -1 + iVar40,rows,cols);
      auVar48._0_4_ = box_integral(iimage,iVar17 + 1,iVar12 + -1 + iVar40,rows,cols_00);
      auVar48._4_60_ = extraout_var;
      auVar8 = vfmadd132ss_fma(auVar48._0_16_,ZEXT416((uint)fVar43),ZEXT416(0xc0400000));
      fVar44 = box_integral(iimage,iVar17,iVar40,cols_00,cols_00);
      iVar29 = iVar15 + -1 + iVar40;
      fVar45 = box_integral(iimage,iVar32 + 1,iVar29,cols_00,cols_00);
      fVar46 = box_integral(iimage,iVar17,iVar29,cols_00,cols_00);
      fVar47 = box_integral(iimage,iVar32 + 1,iVar40,cols_00,cols_00);
      fVar43 = fVar42 * auVar9._0_4_;
      fVar7 = fVar42 * auVar8._0_4_;
      fVar44 = fVar42 * (((fVar45 + fVar44) - fVar46) - fVar47);
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar44 * fVar44 * -0.81)),ZEXT416((uint)fVar7),
                               ZEXT416((uint)fVar43));
      pfVar4[lVar20] = auVar8._0_4_;
      iVar40 = iVar1 + iVar40;
      pbVar5[lVar20] = 0.0 <= fVar43 + fVar7;
      lVar20 = lVar20 + 1;
    }
    iVar16 = iVar16 + iVar1 * iVar26;
    iVar38 = iVar38 + iVar1 * iVar26;
  }
  iVar29 = uVar10 + iVar1;
  uVar22 = iVar29 % iVar1;
  iVar40 = iVar29 - uVar22;
  iVar17 = iVar1 * iVar26;
  local_198 = ((iVar29 + iVar11) - uVar22) * iVar26 + cols_00;
  iVar38 = (iVar29 + cols_00 + ~uVar22) - uVar10;
  iVar16 = iVar26 * iVar38 + cols_00;
  local_190 = (~uVar10 + iVar40) * iVar26 + cols_00;
  for (iVar32 = iVar40; iVar32 <= iVar11; iVar32 = iVar32 + iVar1) {
    iVar18 = iVar32 - cols_00;
    lVar20 = (long)((iVar32 / iVar1) * iVar2);
    iVar41 = 1;
    for (lVar27 = 0; lVar27 < lVar19; lVar27 = lVar27 + lVar37) {
      auVar9 = vfmadd213ss_fma(ZEXT416((uint)(pfVar6[iVar16 + -2 + iVar41] -
                                             pfVar6[local_190 + -2 + iVar41])),
                               SUB6416(ZEXT464(0xc0400000),0),
                               ZEXT416((uint)pfVar6[local_198 + -2 + iVar41]));
      fVar43 = box_integral(iimage,iVar18 + 1,iVar13 + -1 + iVar41,rows,cols);
      auVar49._0_4_ = box_integral(iimage,iVar18 + 1,iVar12 + -1 + iVar41,rows,cols_00);
      auVar49._4_60_ = extraout_var_00;
      auVar8 = vfmadd132ss_fma(auVar49._0_16_,ZEXT416((uint)fVar43),ZEXT416(0xc0400000));
      fVar44 = box_integral(iimage,iVar18,iVar41,cols_00,cols_00);
      iVar30 = iVar15 + -1 + iVar41;
      fVar45 = box_integral(iimage,iVar32 + 1,iVar30,cols_00,cols_00);
      fVar46 = box_integral(iimage,iVar18,iVar30,cols_00,cols_00);
      fVar47 = box_integral(iimage,iVar32 + 1,iVar41,cols_00,cols_00);
      fVar43 = fVar42 * auVar9._0_4_;
      fVar7 = fVar42 * auVar8._0_4_;
      fVar44 = fVar42 * (((fVar45 + fVar44) - fVar46) - fVar47);
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar44 * fVar44 * -0.81)),ZEXT416((uint)fVar7),
                               ZEXT416((uint)fVar43));
      pfVar4[lVar20] = auVar8._0_4_;
      iVar41 = iVar1 + iVar41;
      pbVar5[lVar20] = 0.0 <= fVar43 + fVar7;
      lVar20 = lVar20 + 1;
    }
    local_198 = local_198 + iVar17;
    iVar16 = iVar16 + iVar17;
    local_190 = local_190 + iVar17;
  }
  iVar32 = (cols_00 + -1 + iVar1) / iVar1;
  iVar18 = iVar2 * iVar1;
  iVar17 = iVar32 * iVar1;
  lVar27 = (long)iVar17;
  iVar41 = iVar26 * iVar14;
  lVar20 = lVar37 * lVar39;
  iVar16 = cols_00 + iVar41;
  local_180 = pfVar6 + ((lVar39 * lVar35 + lVar27) - lVar19);
  for (uVar33 = 0; (long)uVar33 <= (long)(int)uVar10; uVar33 = uVar33 + lVar37) {
    iVar24 = (int)uVar33;
    iVar23 = iVar24 - cols_00;
    lVar36 = (long)((int)((long)((ulong)(uint)(iVar24 >> 0x1f) << 0x20 | uVar33 & 0xffffffff) /
                         (long)iVar1) * iVar2 + iVar32);
    iVar30 = iVar17 + 1;
    for (lVar28 = 0; lVar27 + lVar28 <= (long)(iVar18 - cols_00); lVar28 = lVar28 + lVar37) {
      auVar9 = vfmadd213ss_fma(ZEXT416((uint)(pfVar6[iVar16 + -2 + iVar30] -
                                             pfVar6[(lVar27 + iVar41 + lVar28) - lVar19])),
                               SUB6416(ZEXT464(0xc0400000),0),
                               ZEXT416((uint)(pfVar6[(uVar33 + lVar35) * lVar39 +
                                                     (long)(cols_00 + -2 + iVar30)] -
                                             local_180[lVar28])));
      fVar43 = box_integral(iimage,iVar23 + 1,iVar13 + -1 + iVar30,rows,cols);
      auVar50._0_4_ = box_integral(iimage,iVar23 + 1,iVar12 + -1 + iVar30,rows,cols_00);
      auVar50._4_60_ = extraout_var_01;
      auVar8 = vfmadd132ss_fma(auVar50._0_16_,ZEXT416((uint)fVar43),ZEXT416(0xc0400000));
      fVar44 = box_integral(iimage,iVar23,iVar30,cols_00,cols_00);
      iVar31 = iVar15 + -1 + iVar30;
      fVar45 = box_integral(iimage,iVar24 + 1,iVar31,cols_00,cols_00);
      fVar46 = box_integral(iimage,iVar23,iVar31,cols_00,cols_00);
      fVar47 = box_integral(iimage,iVar24 + 1,iVar30,cols_00,cols_00);
      fVar43 = fVar42 * auVar9._0_4_;
      fVar7 = fVar42 * auVar8._0_4_;
      fVar44 = fVar42 * (((fVar45 + fVar44) - fVar46) - fVar47);
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar44 * fVar44 * -0.81)),ZEXT416((uint)fVar7),
                               ZEXT416((uint)fVar43));
      pfVar4[lVar36] = auVar8._0_4_;
      iVar30 = iVar1 + iVar30;
      pbVar5[lVar36] = 0.0 <= fVar43 + fVar7;
      lVar36 = lVar36 + 1;
    }
    iVar16 = iVar16 + iVar1 * iVar26;
    iVar41 = iVar41 + iVar1 * iVar26;
    local_180 = local_180 + lVar20;
  }
  iVar38 = iVar38 * iVar26;
  iVar41 = cols_00 + iVar38;
  iVar30 = iVar1 * iVar26;
  iVar16 = ((~uVar22 + iVar29) - uVar10) * iVar26;
  local_148 = pfVar6 + ((((iVar29 + lVar35) - (long)(int)uVar22) * lVar39 + lVar27) - lVar19);
  iVar29 = cols_00 + iVar16;
  for (uVar33 = (ulong)iVar40; (long)uVar33 <= lVar35; uVar33 = uVar33 + lVar37) {
    iVar31 = (int)uVar33;
    iVar24 = iVar31 - cols_00;
    iVar23 = (int)((long)((ulong)(uint)(iVar31 >> 0x1f) << 0x20 | uVar33 & 0xffffffff) / (long)iVar1
                  ) * iVar2 + iVar32;
    pfVar21 = pfVar4 + iVar23;
    pbVar34 = pbVar5 + iVar23;
    iVar23 = iVar17 + 1;
    for (lVar28 = 0; lVar27 + lVar28 <= (long)(iVar18 - cols_00); lVar28 = lVar28 + lVar37) {
      auVar9 = vfmadd213ss_fma(ZEXT416((uint)((pfVar6[(lVar27 + iVar16 + lVar28) - lVar19] -
                                              pfVar6[(lVar27 + iVar38 + lVar28) - lVar19]) +
                                             (pfVar6[iVar41 + -2 + iVar23] -
                                             pfVar6[iVar29 + -2 + iVar23]))),
                               SUB6416(ZEXT464(0xc0400000),0),
                               ZEXT416((uint)(pfVar6[(uVar33 + lVar35) * lVar39 +
                                                     (long)(cols_00 + -2 + iVar23)] -
                                             local_148[lVar28])));
      fVar43 = box_integral(iimage,iVar24 + 1,iVar13 + -1 + iVar23,rows,cols);
      auVar51._0_4_ = box_integral(iimage,iVar24 + 1,iVar12 + -1 + iVar23,rows,cols_00);
      auVar51._4_60_ = extraout_var_02;
      auVar8 = vfmadd132ss_fma(auVar51._0_16_,ZEXT416((uint)fVar43),ZEXT416(0xc0400000));
      fVar44 = box_integral(iimage,iVar24,iVar23,cols_00,cols_00);
      col = iVar15 + -1 + iVar23;
      fVar45 = box_integral(iimage,iVar31 + 1,col,cols_00,cols_00);
      fVar46 = box_integral(iimage,iVar24,col,cols_00,cols_00);
      fVar47 = box_integral(iimage,iVar31 + 1,iVar23,cols_00,cols_00);
      fVar43 = fVar42 * auVar9._0_4_;
      fVar7 = fVar42 * auVar8._0_4_;
      fVar44 = fVar42 * (((fVar45 + fVar44) - fVar46) - fVar47);
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar44 * fVar44 * -0.81)),ZEXT416((uint)fVar7),
                               ZEXT416((uint)fVar43));
      *pfVar21 = auVar8._0_4_;
      iVar23 = iVar1 + iVar23;
      *pbVar34 = 0.0 <= fVar7 + fVar43;
      pfVar21 = pfVar21 + 1;
      pbVar34 = pbVar34 + 1;
    }
    local_148 = local_148 + lVar20;
    iVar41 = iVar41 + iVar30;
    iVar16 = iVar16 + iVar30;
    iVar29 = iVar29 + iVar30;
    iVar38 = iVar38 + iVar30;
  }
  iVar38 = ((iVar1 - cols_00) + iVar18) / iVar1;
  iVar16 = iVar38 * iVar1;
  lVar27 = (long)iVar16;
  local_1c8 = pfVar6 + ((lVar39 * lVar35 + lVar27) - lVar19);
  iVar32 = iVar26 * iVar14;
  for (uVar33 = 0; (long)uVar33 <= (long)(int)uVar10; uVar33 = uVar33 + lVar37) {
    iVar17 = (int)uVar33;
    iVar41 = iVar17 - cols_00;
    lVar28 = (long)((int)((long)((ulong)(uint)(iVar17 >> 0x1f) << 0x20 | uVar33 & 0xffffffff) /
                         (long)iVar1) * iVar2 + iVar38);
    iVar29 = iVar16 + 1;
    for (lVar36 = 0; lVar27 + lVar36 < (long)iVar18; lVar36 = lVar36 + lVar37) {
      auVar9 = vfmadd213ss_fma(ZEXT416((uint)(pfVar6[(long)((iVar14 + iVar17) * iVar26 + iVar25) +
                                                     -1] -
                                             pfVar6[(lVar27 + iVar32 + lVar36) - lVar19])),
                               SUB6416(ZEXT464(0xc0400000),0),
                               ZEXT416((uint)(pfVar6[(long)iVar25 + (uVar33 + lVar35) * lVar39 + -1]
                                             - local_1c8[lVar36])));
      fVar43 = box_integral(iimage,iVar41 + 1,iVar13 + -1 + iVar29,rows,cols);
      auVar52._0_4_ = box_integral(iimage,iVar41 + 1,iVar12 + -1 + iVar29,rows,cols_00);
      auVar52._4_60_ = extraout_var_03;
      auVar8 = vfmadd132ss_fma(auVar52._0_16_,ZEXT416((uint)fVar43),ZEXT416(0xc0400000));
      fVar44 = box_integral(iimage,iVar41,iVar29,cols_00,cols_00);
      iVar30 = iVar15 + -1 + iVar29;
      fVar45 = box_integral(iimage,iVar17 + 1,iVar30,cols_00,cols_00);
      fVar46 = box_integral(iimage,iVar41,iVar30,cols_00,cols_00);
      fVar47 = box_integral(iimage,iVar17 + 1,iVar29,cols_00,cols_00);
      fVar43 = fVar42 * auVar9._0_4_;
      fVar7 = fVar42 * auVar8._0_4_;
      fVar44 = fVar42 * (((fVar45 + fVar44) - fVar46) - fVar47);
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar44 * fVar44 * -0.81)),ZEXT416((uint)fVar7),
                               ZEXT416((uint)fVar43));
      pfVar4[lVar28] = auVar8._0_4_;
      iVar29 = iVar1 + iVar29;
      pbVar5[lVar28] = 0.0 <= fVar43 + fVar7;
      lVar28 = lVar28 + 1;
    }
    local_1c8 = local_1c8 + lVar20;
    iVar32 = iVar32 + iVar1 * iVar26;
  }
  for (; iVar40 - iVar11 == 0 || iVar40 < iVar11; iVar40 = iVar40 + iVar1) {
    iVar25 = iVar40 - cols_00;
    lVar19 = (long)((iVar40 / iVar1) * iVar2 + iVar38);
    for (iVar26 = iVar16; iVar26 < iVar18; iVar26 = iVar1 + iVar26) {
      fVar43 = box_integral(iimage,iVar25 + 1,iVar26 + iVar13,rows,cols);
      auVar53._0_4_ = box_integral(iimage,iVar25 + 1,iVar12 + iVar26,rows,cols_00);
      auVar53._4_60_ = extraout_var_04;
      auVar9 = vfmadd213ss_fma(auVar53._0_16_,SUB6416(ZEXT464(0xc0400000),0),ZEXT416((uint)fVar43));
      iVar14 = iVar15 + 1 + iVar26;
      fVar43 = box_integral(iimage,iVar40 - iVar11,iVar14,cols,rows);
      auVar54._0_4_ = box_integral(iimage,iVar40 - uVar10,iVar14,cols_00,rows);
      auVar54._4_60_ = extraout_var_05;
      auVar8 = vfmadd132ss_fma(auVar54._0_16_,ZEXT416((uint)fVar43),ZEXT416(0xc0400000));
      fVar44 = box_integral(iimage,iVar25,iVar26 + 1,cols_00,cols_00);
      fVar45 = box_integral(iimage,iVar40 + 1,iVar15 + iVar26,cols_00,cols_00);
      fVar46 = box_integral(iimage,iVar25,iVar15 + iVar26,cols_00,cols_00);
      fVar47 = box_integral(iimage,iVar40 + 1,iVar26 + 1,cols_00,cols_00);
      fVar43 = fVar42 * auVar8._0_4_;
      fVar7 = fVar42 * auVar9._0_4_;
      fVar44 = fVar42 * (((fVar45 + fVar44) - fVar46) - fVar47);
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar44 * fVar44 * -0.81)),ZEXT416((uint)fVar7),
                               ZEXT416((uint)fVar43));
      pfVar4[lVar19] = auVar8._0_4_;
      pbVar5[lVar19] = 0.0 <= fVar7 + fVar43;
      lVar19 = lVar19 + 1;
    }
  }
  for (iVar26 = (iVar11 + iVar1) - (iVar11 + iVar1) % iVar1; iVar26 < iVar3 * iVar1;
      iVar26 = iVar26 + iVar1) {
    iVar14 = iVar26 - cols_00;
    lVar19 = (long)((iVar26 / iVar1) * iVar2);
    iVar38 = iVar15;
    iVar16 = iVar13;
    iVar25 = iVar12;
    for (iVar32 = 1; iVar32 + -1 < iVar18; iVar32 = iVar32 + iVar1) {
      fVar43 = box_integral(iimage,iVar14 + 1,iVar16,rows,cols);
      auVar55._0_4_ = box_integral(iimage,iVar14 + 1,iVar25,rows,cols_00);
      auVar55._4_60_ = extraout_var_06;
      auVar9 = vfmadd213ss_fma(auVar55._0_16_,SUB6416(ZEXT464(0xc0400000),0),ZEXT416((uint)fVar43));
      fVar43 = box_integral(iimage,iVar26 - iVar11,iVar38 + 1,cols,rows);
      auVar56._0_4_ = box_integral(iimage,iVar26 - uVar10,iVar38 + 1,cols_00,rows);
      auVar56._4_60_ = extraout_var_07;
      auVar8 = vfmadd132ss_fma(auVar56._0_16_,ZEXT416((uint)fVar43),ZEXT416(0xc0400000));
      fVar44 = box_integral(iimage,iVar14,iVar32,cols_00,cols_00);
      fVar45 = box_integral(iimage,iVar26 + 1,iVar38,cols_00,cols_00);
      fVar46 = box_integral(iimage,iVar14,iVar38,cols_00,cols_00);
      fVar47 = box_integral(iimage,iVar26 + 1,iVar32,cols_00,cols_00);
      fVar43 = fVar42 * auVar8._0_4_;
      fVar7 = fVar42 * auVar9._0_4_;
      fVar44 = fVar42 * (((fVar45 + fVar44) - fVar46) - fVar47);
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar44 * fVar44 * -0.81)),ZEXT416((uint)fVar7),
                               ZEXT416((uint)fVar43));
      pfVar4[lVar19] = auVar8._0_4_;
      pbVar5[lVar19] = 0.0 <= fVar7 + fVar43;
      lVar19 = lVar19 + 1;
      iVar25 = iVar25 + iVar1;
      iVar16 = iVar16 + iVar1;
      iVar38 = iVar38 + iVar1;
    }
  }
  return;
}

Assistant:

void compute_response_layer_Dyy_top(struct response_layer* layer, struct integral_image* iimage) {
    /*
        base function: compute_response_layer_Dyy_leftcorner

        optimization:
        - Dyy box filter hand optimized and split into cases
            => here only top cases
    */
    float Dxx, Dyy, Dxy;
    int x, y, k, k0;
    int r00, r01, c00, c01, r10, r11, c10, c11;
    float Dyy0, Dyy1, A, B, C, D, temp0, temp1;

    float* response = layer->response;
    bool* laplacian = layer->laplacian;

    int data_width = iimage->data_width;
    int step = layer->step;
    int filter_size = layer->filter_size;
    int height = layer->height;
    int width = layer->width;

    int lobe = filter_size / 3;
    int border = (filter_size - 1) / 2;
    float inv_area = 1.f / (filter_size*filter_size);

    int ind = 0;  // oder alternativ (i+1)*j

    float *data = (float*) iimage->data;  // brauch hier keinen cast weil es eig float sein sollte
    int iheight = iimage->height;
    int iwidth = iimage->width;

    // Top Left Corner - Case 1: B of neg part outside
    for (int i = 0; i < lobe / 2 + 1; i += step) {  // Inner B is outside, i.e. 0
        ind = (i / step) * width;

        for (int j = 0; j < lobe; j += step) {  // c0 = col - 1 = (y - lobe + 1) -1 < 0
            // Image coordinates
            x = i;
            y = j;

            // Compute Dyy  
            // whole box filter
            r01 = x + border;
            c01 = y + lobe - 1;

            Dyy0 = data[r01 * data_width + c01];

            // neg part box filter
            r10 = x - lobe / 2 - 1;
            r11 = r10 + lobe;  // -1 is already part of r10
            c11 = y + lobe - 1;

            D = data[r11 * data_width + c11];
            Dyy1 = D;

            Dyy = Dyy0 - 3 * Dyy1;

            // Compute Dxx, Dxy
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2 * lobe - 1, filter_size) -
                  3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2 * lobe - 1, lobe);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Top Left Corner - Case 2: B of neg part inside
    // initial value has to be rounded up to next bigger step
    k = (lobe / 2 + 1 + step - 1) / step * step;

    for (int i = k; i < border + 1; i += step) {  // Inner B is inside
        ind = (i / step) * width;

        for (int j = 0; j < lobe; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Compute Dyy
            // whole box filter
            r01 = x + border;
            c01 = y + lobe - 1;

            Dyy0 = data[r01 * data_width + c01];

            // neg part box filter
            r10 = x - lobe / 2 - 1;
            r11 = r10 + lobe;   // -1 is already part of r10
            c11 = y + lobe - 1;

            B = data[r10 * data_width + c11];
            D = data[r11 * data_width + c11];
            Dyy1 = D - B;

            Dyy = Dyy0 - 3 * Dyy1;

            // Compute Dxx, Dxy
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2 * lobe - 1, filter_size) -
                  3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2 * lobe - 1, lobe);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Top Mid - Case 1: B of neg part outside
    k0 = (lobe + step - 1) / step * step;  // initial y value to next multiple of step

    for (int i = 0; i < lobe / 2 + 1; i += step) {
        ind = (i / step) * width + (k0 / step);

        for (int j = k0; j < width * step -lobe+1; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Compute Dyy
            // whole box filter
            // A and B are outside (= 0), C and D inside
            r01 = x + border;
            c00 = y - lobe;
            c01 = y + lobe - 1;

            C = data[r01 * data_width + c00];
            D = data[r01 * data_width + c01];
            Dyy0 = D - C;

            // neg part box filter
            // A and B are outside (= 0), C and D inside
            r10 = x - lobe / 2 - 1;
            r11 = r10 + lobe;   // r10 und r11 kann man vereinfachen
            c10 = y - lobe;
            c11 = y + lobe - 1;

            C = data[r11 * data_width + c10];
            D = data[r11 * data_width + c11];

            Dyy1 = D - C;

            Dyy = Dyy0 - 3*Dyy1;

            // Compute Dxx, Dxy
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                    - 3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe)
                    + box_integral(iimage, x + 1, y - lobe, lobe, lobe)
                    - box_integral(iimage, x - lobe, y - lobe, lobe, lobe)
                    - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Top Mid - Case 2: B of neg part inside
    k = (lobe / 2 + 1 + step - 1) / step * step;  // round initial value to next highest step
    for (int i = k; i < border+1; i += step) {
        ind = (i / step) * width + (k0 / step);

        for (int j = k0; j < width * step -lobe+1; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Compute Dyy
            // whole box filter
            r01 = x + border;
            c00 = y - lobe;
            c01 = y + lobe - 1;

            C = data[r01 * data_width + c00];
            D = data[r01 * data_width + c01];
            Dyy0 = D - C;

            // neg part box filter
            r10 = x - lobe / 2 - 1;
            r11 = r10 + lobe;
            c10 = y - lobe;
            c11 = y + lobe - 1;

            A = data[r10 * data_width + c10];
            B = data[r10 * data_width + c11];
            C = data[r11 * data_width + c10];
            D = data[r11 * data_width + c11];

            temp0 = A - C;
            temp1 = D - B;
            Dyy1 = temp0 + temp1;

            Dyy = Dyy0 - 3*Dyy1;

            // Compute Dxx, Dxy
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                    - 3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe)
                    + box_integral(iimage, x + 1, y - lobe, lobe, lobe)
                    - box_integral(iimage, x - lobe, y - lobe, lobe, lobe)
                    - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Top Right - Case 1: A of neg part outside
    k0 = (width*step-lobe+1 + step - 1) / step * step;

    for (int i = 0; i < lobe/2+1; i += step) {
        ind = (i / step) * width + (k0 / step);

        for (int j = k0; j < width * step; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // whole filter
            r01 = x + border;
            c00 = y - lobe;

            C = data[r01 * data_width + c00];
            D = data[r01 * data_width + iwidth-1];
            Dyy0 = D - C;

            // neg part box filter
            r10 = x - lobe / 2 - 1;
            r11 = r10 + lobe;
            c10 = y - lobe;

            C = data[r11 * data_width + c10];
            D = data[r11 * data_width + iwidth-1];

            Dyy1 = D - C;

            Dyy = Dyy0 - 3*Dyy1;

            // Compute Dxx, Dxy
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                    - 3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe)
                    + box_integral(iimage, x + 1, y - lobe, lobe, lobe)
                    - box_integral(iimage, x - lobe, y - lobe, lobe, lobe)
                    - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Top Right - Case 2: A of neg part inside
    k = (lobe / 2 + 1 + step - 1) / step * step;

    for (int i = k; i < border+1; i += step) {
        ind = (i / step) * width + (k0 / step);

        for (int j = k0; j < width * step; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // whole filter
            r01 = x + border;
            c00 = y - lobe;

            C = data[r01 * data_width + c00];
            D = data[r01 * data_width + iwidth-1];
            Dyy0 = D - C;

            // neg part box filter
            r10 = x - lobe / 2 - 1;
            r11 = r10 + lobe;
            c10 = y - lobe;

            A = data[r10 * data_width + c10];
            B = data[r10 * data_width + iwidth-1];
            C = data[r11 * data_width + c10];
            D = data[r11 * data_width + iwidth-1];

            temp0 = A - C;
            temp1 = D - B;
            Dyy1 = temp0 + temp1;

            Dyy = Dyy0 - 3*Dyy1;

            // Compute Dxx, Dxy
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                    - 3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
            Dyy = box_integral(iimage, x - border, y - lobe + 1, filter_size, 2*lobe - 1)
                    - 3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2*lobe - 1);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe)
                    + box_integral(iimage, x + 1, y - lobe, lobe, lobe)
                    - box_integral(iimage, x - lobe, y - lobe, lobe, lobe)
                    - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Rest
    k = (border + 1 + step - 1) / step * step;

    for (int i = k; i < height * step; i += step) {
        ind = (i / step) * width;

        for (int j = 0; j < width * step; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2 * lobe - 1, filter_size) -
                  3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2 * lobe - 1, lobe);
            Dyy = box_integral(iimage, x - border, y - lobe + 1, filter_size, 2 * lobe - 1) -
                  3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2 * lobe - 1);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }
}